

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TabBarScrollToTab(ImGuiTabBar *tab_bar,ImGuiTabItem *tab)

{
  int iVar1;
  long in_RSI;
  int *in_RDI;
  float fVar2;
  float fVar3;
  float tab_x2;
  float tab_x1;
  int order;
  float margin;
  ImGuiContext *g;
  ImGuiTabItem *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  float local_38;
  float local_30;
  
  local_38 = GImGui->FontSize * 1.0;
  iVar1 = ImGuiTabBar::GetTabOrder
                    ((ImGuiTabBar *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
  if (iVar1 < 1) {
    local_30 = 0.0;
  }
  else {
    local_30 = -local_38;
  }
  local_30 = *(float *)(in_RSI + 0x10) + local_30;
  if (*in_RDI <= iVar1 + 1) {
    local_38 = 1.0;
  }
  local_38 = *(float *)(in_RSI + 0x10) + *(float *)(in_RSI + 0x14) + local_38;
  if (local_30 < (float)in_RDI[0x12]) {
    in_RDI[0x12] = (int)local_30;
  }
  fVar3 = (float)in_RDI[0x12];
  fVar2 = ImRect::GetWidth((ImRect *)(in_RDI + 10));
  if (fVar3 + fVar2 < local_38) {
    fVar3 = ImRect::GetWidth((ImRect *)(in_RDI + 10));
    in_RDI[0x12] = (int)(local_38 - fVar3);
  }
  return;
}

Assistant:

static void ImGui::TabBarScrollToTab(ImGuiTabBar* tab_bar, ImGuiTabItem* tab)
{
    ImGuiContext& g = *GImGui;
    float margin = g.FontSize * 1.0f; // When to scroll to make Tab N+1 visible always make a bit of N visible to suggest more scrolling area (since we don't have a scrollbar)
    int order = tab_bar->GetTabOrder(tab);
    float tab_x1 = tab->Offset + (order > 0 ? -margin : 0.0f);
    float tab_x2 = tab->Offset + tab->Width + (order + 1 < tab_bar->Tabs.Size ? margin : 1.0f);
    if (tab_bar->ScrollingTarget > tab_x1)
        tab_bar->ScrollingTarget = tab_x1;
    if (tab_bar->ScrollingTarget + tab_bar->BarRect.GetWidth() < tab_x2)
        tab_bar->ScrollingTarget = tab_x2 - tab_bar->BarRect.GetWidth();
}